

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O2

void CSOAA::output_example(vw *all,example *ec,bool *hit_loss,multi_ex *ec_seq,ldf *data)

{
  uint64_t *puVar1;
  float fVar2;
  wclass *pwVar3;
  pointer ppeVar4;
  pointer ppeVar5;
  int *piVar6;
  _func_void_int_string_v_array<char> *p_Var7;
  v_array<char> vVar8;
  bool bVar9;
  char cVar10;
  int iVar11;
  ulong uVar12;
  polyprediction *ppVar13;
  long lVar14;
  ostream *poVar15;
  ulong uVar16;
  uint32_t *puVar17;
  byte bVar18;
  float *pfVar19;
  int *piVar20;
  long lVar21;
  float fVar22;
  undefined8 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde8;
  uint32_t prediction;
  wclass *pwVar23;
  wclass *pwVar24;
  string local_1f8 [32];
  string outputString;
  stringstream outputStringStream;
  ostream local_1a8;
  
  pwVar3 = (ec->l).cs.costs._begin;
  pwVar23 = (ec->l).cs.costs._end;
  iVar11 = example_is_newline(ec);
  if (((iVar11 == 0) && (bVar9 = COST_SENSITIVE::ec_is_example_header(ec), !bVar9)) &&
     (bVar9 = ec_is_label_definition(ec), !bVar9)) {
    puVar1 = &all->sd->total_features;
    *puVar1 = *puVar1 + ec->num_features;
    if (data->is_probabilities == true) {
      ppeVar4 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      ppeVar5 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      bVar9 = COST_SENSITIVE::ec_is_example_header(*ppeVar4);
      fVar22 = 3.4028235e+38;
      uVar12 = (ulong)bVar9;
      for (uVar16 = uVar12; uVar16 < (ulong)((long)ppeVar5 - (long)ppeVar4 >> 3);
          uVar16 = uVar16 + 1) {
        fVar2 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar16]->partial_prediction;
        if (fVar2 < fVar22) {
          uVar12 = uVar16 & 0xffffffff;
          fVar22 = fVar2;
        }
      }
      ppVar13 = (polyprediction *)
                &(((ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar12]->l).cs.costs._begin)->class_index;
    }
    else {
      ppVar13 = &ec->pred;
    }
    prediction = ppVar13->multiclass;
    pwVar24 = pwVar23;
    cVar10 = (*(code *)PTR_test_label_002a7ac0)(&ec->l);
    if (cVar10 == '\0') {
      lVar14 = (long)pwVar23 - (long)pwVar3 >> 4;
      bVar18 = *hit_loss;
      puVar17 = &pwVar3->class_index;
      fVar22 = 0.0;
      while ((bVar9 = lVar14 != 0, lVar14 = lVar14 + -1, bVar9 && ((bVar18 & 1) == 0))) {
        if (prediction == *puVar17) {
          fVar22 = ((wclass *)(puVar17 + -1))->x;
          *hit_loss = true;
          bVar18 = 1;
        }
        puVar17 = puVar17 + 4;
      }
      all->sd->sum_loss = all->sd->sum_loss + (double)fVar22;
      all->sd->sum_loss_since_last_dump = (double)fVar22 + all->sd->sum_loss_since_last_dump;
    }
    piVar6 = (all->final_prediction_sink)._end;
    for (piVar20 = (all->final_prediction_sink)._begin; piVar20 != piVar6; piVar20 = piVar20 + 1) {
      fVar22 = (ec->pred).scalar;
      if (data->is_probabilities == false) {
        fVar22 = (float)(uint)fVar22;
      }
      (*all->print)(*piVar20,fVar22,0.0,ec->tag);
    }
    if (0 < all->raw_prediction) {
      outputString._M_dataplus._M_p = (pointer)&outputString.field_2;
      outputString._M_string_length = 0;
      outputString.field_2._M_local_buf[0] = '\0';
      std::__cxx11::stringstream::stringstream
                ((stringstream *)&outputStringStream,(string *)&outputString,_S_out|_S_in);
      lVar21 = (long)pwVar24 - (long)pwVar3;
      pfVar19 = &pwVar3->partial_prediction;
      for (lVar14 = 0; lVar21 >> 4 != lVar14; lVar14 = lVar14 + 1) {
        if (lVar14 != 0) {
          std::operator<<(&local_1a8,' ');
        }
        poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
        poVar15 = std::operator<<(poVar15,':');
        std::ostream::operator<<(poVar15,*pfVar19);
        pfVar19 = pfVar19 + 4;
      }
      p_Var7 = all->print_text;
      iVar11 = all->raw_prediction;
      std::__cxx11::stringbuf::str();
      vVar8._end = (char *)all;
      vVar8._begin = (char *)in_stack_fffffffffffffdd8;
      vVar8.end_array._0_4_ = in_stack_fffffffffffffde8;
      vVar8.end_array._4_4_ = prediction;
      vVar8.erase_count = (size_t)pwVar24;
      (*p_Var7)(iVar11,(string)ec->tag,vVar8);
      std::__cxx11::string::~string(local_1f8);
      std::__cxx11::stringstream::~stringstream((stringstream *)&outputStringStream);
      std::__cxx11::string::~string((string *)&outputString);
    }
    bVar9 = (bool)(*(code *)PTR_test_label_002a7ac0)(&ec->l);
    COST_SENSITIVE::print_update(all,bVar9,ec,ec_seq,false,prediction);
  }
  return;
}

Assistant:

void output_example(vw& all, example& ec, bool& hit_loss, multi_ex* ec_seq, ldf& data)
{
  label& ld = ec.l.cs;
  v_array<COST_SENSITIVE::wclass> costs = ld.costs;

  if (example_is_newline(ec))
    return;
  if (ec_is_example_header(ec))
    return;
  if (ec_is_label_definition(ec))
    return;

  all.sd->total_features += ec.num_features;

  float loss = 0.;

  uint32_t predicted_class;
  if (data.is_probabilities)
  {
    // predicted_K was already computed in do_actual_learning(),
    // but we cannot store it in ec.pred union because we store ec.pred.prob there.
    // So we must compute it again.
    size_t start_K = 0;
    size_t K = ec_seq->size();
    if (ec_is_example_header(*(*ec_seq)[0]))
      start_K = 1;
    uint32_t predicted_K = (uint32_t)start_K;
    float min_score = FLT_MAX;
    for (size_t k = start_K; k < K; k++)
    {
      example* ec_k = (*ec_seq)[k];
      if (ec_k->partial_prediction < min_score)
      {
        min_score = ec_k->partial_prediction;
        predicted_K = (uint32_t)k;
      }
    }
    predicted_class = (*ec_seq)[predicted_K]->l.cs.costs[0].class_index;
  }
  else
    predicted_class = ec.pred.multiclass;

  if (!COST_SENSITIVE::cs_label.test_label(&ec.l))
  {
    for (size_t j = 0; j < costs.size(); j++)
    {
      if (hit_loss)
        break;
      if (predicted_class == costs[j].class_index)
      {
        loss = costs[j].x;
        hit_loss = true;
      }
    }

    all.sd->sum_loss += loss;
    all.sd->sum_loss_since_last_dump += loss;
  }

  for (int sink : all.final_prediction_sink)
    all.print(sink, data.is_probabilities ? ec.pred.prob : (float)ec.pred.multiclass, 0, ec.tag);

  if (all.raw_prediction > 0)
  {
    string outputString;
    stringstream outputStringStream(outputString);
    for (size_t i = 0; i < costs.size(); i++)
    {
      if (i > 0)
        outputStringStream << ' ';
      outputStringStream << costs[i].class_index << ':' << costs[i].partial_prediction;
    }
    // outputStringStream << endl;
    all.print_text(all.raw_prediction, outputStringStream.str(), ec.tag);
  }

  COST_SENSITIVE::print_update(all, COST_SENSITIVE::cs_label.test_label(&ec.l), ec, ec_seq, false, predicted_class);
}